

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O1

MPP_RET h264e_vepu_buf_set_cabac_idc(HalH264eVepuBufs *bufs,RK_S32 idc)

{
  uint uVar1;
  uint uVar2;
  MppBuffer buffer;
  byte bVar3;
  uint uVar4;
  undefined1 *puVar5;
  long lVar6;
  RK_S32 (*paRVar7) [2];
  long lVar8;
  int iVar9;
  byte bVar10;
  int iVar11;
  long lVar12;
  uint *puVar13;
  bool bVar14;
  RK_U8 table [48256];
  uint local_bcb8 [12066];
  
  puVar13 = local_bcb8;
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter %p\n","h264e_vepu_buf_set_cabac_idc");
  }
  if ((-1 < idc) && (bufs->cabac_table == (MppBuffer)0x0)) {
    mpp_buffer_get_with_tag
              (bufs->group,&bufs->cabac_table,0xbc80,"hal_h264e_vepu_v2",
               "h264e_vepu_buf_set_cabac_idc");
  }
  buffer = bufs->cabac_table;
  if (((buffer != (MppBuffer)0x0) && (-1 < idc)) && (bufs->cabac_init_idc != idc)) {
    lVar12 = 0;
    memset(local_bcb8,0,0xbc80);
    do {
      puVar5 = (undefined1 *)puVar13;
      lVar6 = 0;
      do {
        paRVar7 = h264_context_init[(uint)idc];
        if (lVar6 == 0) {
          paRVar7 = h264_context_init_intra;
        }
        lVar8 = 0;
        do {
          iVar9 = ((*(RK_S32 (*) [460] [2])paRVar7)[lVar8][0] * (int)lVar12 >> 4) +
                  (*(RK_S32 (*) [460] [2])paRVar7)[lVar8][1];
          iVar11 = iVar9;
          if (0x7d < iVar9) {
            iVar11 = 0x7e;
          }
          if (iVar11 < 2) {
            iVar11 = 1;
          }
          bVar3 = (char)iVar11 * '\x02';
          bVar10 = bVar3 + 0x81;
          if (iVar9 < 0x40) {
            bVar10 = bVar3 ^ 0x7e;
          }
          puVar5[lVar8] = bVar10;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x1cc);
        puVar5 = puVar5 + 0x1d0;
        bVar14 = lVar6 == 0;
        lVar6 = lVar6 + 1;
      } while (bVar14);
      lVar12 = lVar12 + 1;
      puVar13 = (uint *)((long)puVar13 + 0x3a0);
    } while (lVar12 != 0x34);
    uVar4 = 0x2f22;
    puVar13 = local_bcb8 + 1;
    do {
      uVar1 = puVar13[-1];
      uVar2 = *puVar13;
      puVar13[-1] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      *puVar13 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      puVar13 = puVar13 + 2;
      uVar4 = uVar4 - 2;
    } while (2 < uVar4);
    mpp_buffer_write_with_caller(buffer,0,local_bcb8,0xbc80,"vepu_write_cabac_table");
  }
  bufs->cabac_init_idc = idc;
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave %p\n","h264e_vepu_buf_set_cabac_idc",bufs);
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_buf_set_cabac_idc(HalH264eVepuBufs *bufs, RK_S32 idc)
{
    hal_h264e_dbg_buffer("enter %p\n", bufs);

    if (idc >= 0 && !bufs->cabac_table)
        mpp_buffer_get(bufs->group, &bufs->cabac_table, H264E_CABAC_TABLE_BUF_SIZE);

    if (bufs->cabac_table && idc != bufs->cabac_init_idc && idc >= 0)
        vepu_write_cabac_table(bufs->cabac_table, idc);

    bufs->cabac_init_idc = idc;

    hal_h264e_dbg_buffer("leave %p\n", bufs);

    return MPP_OK;
}